

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O3

_Bool object_mergeable(object *obj1,object *obj2,object_stack_t mode)

{
  _Bool _Var1;
  wchar_t wVar2;
  
  if ((mode & OSTACK_STORE) == OSTACK_NONE) {
    wVar2 = (uint)obj2->number + (uint)obj1->number;
    if (obj1->kind->base->max_stack < wVar2) {
      return false;
    }
    if ((mode & OSTACK_QUIVER) != OSTACK_NONE) {
      _Var1 = tval_is_ammo(obj1);
      if (_Var1) {
        if ((uint)z_info->quiver_slot_size < (uint)wVar2) {
          return false;
        }
      }
      else if ((uint)z_info->quiver_slot_size / (uint)z_info->thrown_quiver_mult < (uint)wVar2) {
        return false;
      }
    }
  }
  _Var1 = object_similar(obj1,obj2,mode);
  if (!_Var1) {
    return false;
  }
  if (obj1->note == 0) {
    return true;
  }
  return obj1->note == obj2->note || obj2->note == 0;
}

Assistant:

bool object_mergeable(const struct object *obj1, const struct object *obj2,
					object_stack_t mode)
{
	int total = obj1->number + obj2->number;

	/* Check against stacking limit - except in stores which absorb anyway */
	if (!(mode & OSTACK_STORE)) {
		if (total > obj1->kind->base->max_stack) {
			return false;
		}
		/* The quiver can impose stricter limits. */
		if (mode & OSTACK_QUIVER) {
			if (tval_is_ammo(obj1)) {
				if (total > z_info->quiver_slot_size) {
					return false;
				}
			} else {
				if (total > z_info->quiver_slot_size /
						z_info->thrown_quiver_mult) {
					return false;
				}
			}
		}
	}

	return object_stackable(obj1, obj2, mode);
}